

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

void ggml_gallocr_free(ggml_gallocr_t galloc)

{
  ggml_backend_buffer_t *ppgVar1;
  ggml_dyn_tallocr **ppgVar2;
  long lVar3;
  long lVar4;
  
  if (galloc == (ggml_gallocr_t)0x0) {
    return;
  }
  if (0 < galloc->n_buffers) {
    lVar4 = 0;
    do {
      ppgVar1 = galloc->buffers;
      if (ppgVar1 != (ggml_backend_buffer_t *)0x0) {
        if (lVar4 != 0) {
          lVar3 = 0;
          do {
            if (ppgVar1[lVar3] == ppgVar1[lVar4]) goto LAB_00123d75;
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        ggml_backend_buffer_free(ppgVar1[lVar4]);
      }
LAB_00123d75:
      ppgVar2 = galloc->buf_tallocs;
      if (ppgVar2 != (ggml_dyn_tallocr **)0x0) {
        if (lVar4 != 0) {
          lVar3 = 0;
          do {
            if (ppgVar2[lVar3] == ppgVar2[lVar4]) goto LAB_00123da0;
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        free(ppgVar2[lVar4]);
      }
LAB_00123da0:
      lVar4 = lVar4 + 1;
    } while (lVar4 < galloc->n_buffers);
  }
  ggml_hash_set_free(&galloc->hash_set);
  free(galloc->hash_values);
  free(galloc->bufts);
  free(galloc->buffers);
  free(galloc->buf_tallocs);
  free(galloc->node_allocs);
  free(galloc->leaf_allocs);
  free(galloc);
  return;
}

Assistant:

void ggml_gallocr_free(ggml_gallocr_t galloc) {
    if (galloc == NULL) {
        return;
    }

    for (int i = 0; i < galloc->n_buffers; i++) {
        if (galloc->buffers != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buffers[j] == galloc->buffers[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_backend_buffer_free(galloc->buffers[i]);
            }
        }
        if (galloc->buf_tallocs != NULL) {
            // skip if already freed
            bool freed = false;
            for (int j = 0; j < i; j++) {
                if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                    freed = true;
                    break;
                }
            }
            if (!freed) {
                ggml_dyn_tallocr_free(galloc->buf_tallocs[i]);
            }
        }
    }

    ggml_hash_set_free(&galloc->hash_set);
    free(galloc->hash_values);
    free(galloc->bufts);
    free(galloc->buffers);
    free(galloc->buf_tallocs);
    free(galloc->node_allocs);
    free(galloc->leaf_allocs);
    free(galloc);
}